

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

double __thiscall soplex::SPxScaler<double>::minAbsColscale(SPxScaler<double> *this)

{
  DataArray<int> *pDVar1;
  double dVar2;
  ulong uVar3;
  ulong *puVar4;
  int i;
  long lVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 local_28 [16];
  
  pDVar1 = this->m_activeColscaleExp;
  puVar4 = (ulong *)infinity();
  local_28._8_8_ = 0;
  local_28._0_8_ = *puVar4;
  for (lVar5 = 0; lVar5 < pDVar1->thesize; lVar5 = lVar5 + 1) {
    dVar2 = ldexp(1.0,pDVar1->data[lVar5]);
    if (ABS(dVar2) < (double)local_28._0_8_) {
      dVar2 = ldexp(1.0,pDVar1->data[lVar5]);
      uVar3 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
      local_28._8_4_ = (int)uVar3;
      local_28._0_8_ = ABS(dVar2);
      local_28._12_4_ = (int)(uVar3 >> 0x20);
    }
  }
  return (double)local_28._0_8_;
}

Assistant:

R SPxScaler<R>::minAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R mini = R(infinity);

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) < mini)
         mini = spxAbs(spxLdexp(1.0, colscaleExp[i]));

   return mini;
}